

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O1

void nni_listener_rele(nni_listener *l)

{
  int *piVar1;
  _Bool _Var2;
  
  nni_mtx_lock(&listeners_lk);
  if (l->l_ref < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/listener.c",
              0x165,"l->l_ref > 0");
  }
  piVar1 = &l->l_ref;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    nni_mtx_unlock(&listeners_lk);
    return;
  }
  _Var2 = l->l_closed;
  nni_mtx_unlock(&listeners_lk);
  if (_Var2 == true) {
    nni_listener_reap(l);
    return;
  }
  return;
}

Assistant:

void
nni_listener_rele(nni_listener *l)
{
	bool reap;

	nni_mtx_lock(&listeners_lk);
	NNI_ASSERT(l->l_ref > 0);
	l->l_ref--;
	reap = ((l->l_ref == 0) && (l->l_closed));
	nni_mtx_unlock(&listeners_lk);
	if (reap) {
		nni_listener_reap(l);
	}
}